

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

char * conf_get_str_strs(Conf *conf,int primary,char *subkeyin,char **subkeyout)

{
  int *local_48;
  conf_entry *entry;
  constkey key;
  char **subkeyout_local;
  char *subkeyin_local;
  int primary_local;
  Conf *conf_local;
  
  key.secondary = (anon_union_8_2_9473010b_for_secondary)subkeyout;
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x158,"char *conf_get_str_strs(Conf *, int, char *, char **)");
  }
  if (valuetypes[primary] == 3) {
    entry._0_4_ = primary;
    if (subkeyin == (char *)0x0) {
      key._0_8_ = (long)"  (%zu byte%s omitted)\r\n" + 0x18;
      local_48 = (int *)findrel234(conf->tree,&entry,conf_cmp_constkey,4);
    }
    else {
      key._0_8_ = subkeyin;
      local_48 = (int *)findrel234(conf->tree,&entry,(cmpfn234)0x0,3);
    }
    if ((local_48 == (int *)0x0) || (*local_48 != primary)) {
      conf_local = (Conf *)0x0;
    }
    else {
      *(undefined8 *)key.secondary.s = *(undefined8 *)(local_48 + 2);
      conf_local = *(Conf **)(local_48 + 4);
    }
    return (char *)conf_local;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x159,"char *conf_get_str_strs(Conf *, int, char *, char **)");
}

Assistant:

char *conf_get_str_strs(Conf *conf, int primary,
                       char *subkeyin, char **subkeyout)
{
    struct constkey key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    if (subkeyin) {
        key.secondary.s = subkeyin;
        entry = findrel234(conf->tree, &key, NULL, REL234_GT);
    } else {
        key.secondary.s = "";
        entry = findrel234(conf->tree, &key, conf_cmp_constkey, REL234_GE);
    }
    if (!entry || entry->key.primary != primary)
        return NULL;
    *subkeyout = entry->key.secondary.s;
    return entry->value.u.stringval;
}